

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall
PField::PField(PField *this,FName *name,PType *type,DWORD flags,size_t offset,int bitvalue)

{
  bool bVar1;
  char *pcVar2;
  uint local_3c;
  FName local_38;
  uint val;
  size_t sStack_30;
  int bitvalue_local;
  size_t offset_local;
  PType *pPStack_20;
  DWORD flags_local;
  PType *type_local;
  FName *name_local;
  PField *this_local;
  
  val = bitvalue;
  sStack_30 = offset;
  offset_local._4_4_ = flags;
  pPStack_20 = type;
  type_local = (PType *)name;
  name_local = (FName *)this;
  FName::FName(&local_38,name);
  PSymbol::PSymbol(&this->super_PSymbol,&local_38);
  (this->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f3c68;
  this->Offset = sStack_30;
  this->Type = pPStack_20;
  this->Flags = offset_local._4_4_;
  if (val == 0) {
    this->BitValue = -1;
  }
  else {
    this->BitValue = 0;
    local_3c = val;
    while (local_3c = local_3c >> 1, local_3c != 0) {
      this->BitValue = this->BitValue + 1;
    }
    bVar1 = DObject::IsA((DObject *)pPStack_20,PInt::RegistrationInfo.MyClass);
    if ((bVar1) &&
       ((uint)this->BitValue <
        (uint)(*(int *)&(pPStack_20->super_PTypeBase).super_DObject.field_0x24 << 3))) {
      this->Offset = (long)(this->BitValue / 8) + this->Offset;
      this->BitValue = this->BitValue & 7;
      this->Type = (PType *)TypeBool;
    }
    else {
      pcVar2 = FName::GetChars(name);
      I_Error("Trying to create an invalid bit field element: %s",pcVar2);
    }
  }
  return;
}

Assistant:

PField::PField(FName name, PType *type, DWORD flags, size_t offset, int bitvalue)
	: PSymbol(name), Offset(offset), Type(type), Flags(flags)
{
	if (bitvalue != 0)
	{
		BitValue = 0;
		unsigned val = bitvalue;
		while ((val >>= 1)) BitValue++;

		if (type->IsA(RUNTIME_CLASS(PInt)) && unsigned(BitValue) < 8u * type->Size)
		{
			// map to the single bytes in the actual variable. The internal bit instructions operate on 8 bit values.
#ifndef __BIG_ENDIAN__
			Offset += BitValue / 8;
#else
			Offset += type->Size - 1 - BitValue / 8;
#endif
			BitValue &= 7;
			Type = TypeBool;
		}
		else
		{
			// Just abort. Bit fields should only be defined internally.
			I_Error("Trying to create an invalid bit field element: %s", name.GetChars());
		}
	}
	else BitValue = -1;
}